

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::ast::DistExpression::DistItem>::
emplaceRealloc<slang::ast::DistExpression::DistItem&>
          (SmallVectorBase<slang::ast::DistExpression::DistItem> *this,pointer pos,DistItem *args)

{
  undefined8 *puVar1;
  ulong uVar2;
  size_type sVar3;
  Expression *pEVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  undefined7 uVar8;
  pointer pDVar9;
  pointer pDVar10;
  DistItem *__cur;
  pointer pDVar11;
  EVP_PKEY_CTX *ctx;
  long lVar12;
  ulong capacity;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar2 = this->cap;
  if (capacity < uVar2 * 2) {
    capacity = uVar2 * 2;
  }
  if (0x7fffffffffffffff - uVar2 < uVar2) {
    capacity = 0x7fffffffffffffff;
  }
  lVar12 = (long)pos - (long)this->data_;
  ctx = (EVP_PKEY_CTX *)0x20;
  pDVar9 = (pointer)detail::allocArray(capacity,0x20);
  pEVar4 = args->value;
  uVar5 = *(undefined8 *)
           &(args->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
            _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
            _M_payload;
  uVar6 = *(undefined8 *)
           &(args->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
            _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
            _M_engaged;
  puVar1 = (undefined8 *)((long)pDVar9 + lVar12 + 0x10);
  *puVar1 = (args->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
            _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
            _M_payload._M_value.expr;
  puVar1[1] = uVar6;
  *(undefined8 *)((long)pDVar9 + lVar12) = pEVar4;
  ((undefined8 *)((long)pDVar9 + lVar12))[1] = uVar5;
  pDVar10 = this->data_;
  pDVar11 = pDVar9;
  if (pDVar10 + this->len == pos) {
    for (; pDVar10 != pos; pDVar10 = pDVar10 + 1) {
      pEVar4 = pDVar10->value;
      uVar5 = *(undefined8 *)
               &(pDVar10->weight).
                super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload;
      bVar7 = (pDVar10->weight).
              super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged;
      uVar8 = *(undefined7 *)
               &(pDVar10->weight).
                super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.field_0x11;
      (pDVar11->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
      _M_value.expr =
           (pDVar10->weight).
           super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
           super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload._M_value.
           expr;
      (pDVar11->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged =
           bVar7;
      *(undefined7 *)
       &(pDVar11->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.field_0x11 =
           uVar8;
      pDVar11->value = pEVar4;
      *(undefined8 *)
       &(pDVar11->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload =
           uVar5;
      pDVar11 = pDVar11 + 1;
    }
  }
  else {
    for (; pDVar10 != pos; pDVar10 = pDVar10 + 1) {
      pEVar4 = pDVar10->value;
      uVar5 = *(undefined8 *)
               &(pDVar10->weight).
                super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload;
      bVar7 = (pDVar10->weight).
              super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged;
      uVar8 = *(undefined7 *)
               &(pDVar10->weight).
                super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.field_0x11;
      (pDVar11->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
      _M_value.expr =
           (pDVar10->weight).
           super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
           super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload._M_value.
           expr;
      (pDVar11->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged =
           bVar7;
      *(undefined7 *)
       &(pDVar11->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.field_0x11 =
           uVar8;
      pDVar11->value = pEVar4;
      *(undefined8 *)
       &(pDVar11->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload =
           uVar5;
      pDVar11 = pDVar11 + 1;
    }
    sVar3 = this->len;
    pDVar10 = this->data_;
    puVar1 = (undefined8 *)((long)pDVar9 + lVar12);
    for (; pos != pDVar10 + sVar3; pos = pos + 1) {
      pEVar4 = pos->value;
      uVar5 = *(undefined8 *)
               &(pos->weight).
                super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload;
      uVar6 = *(undefined8 *)
               &(pos->weight).
                super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged;
      puVar1[6] = (pos->weight).
                  super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
                  _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
                  _M_payload._M_value.expr;
      puVar1[7] = uVar6;
      puVar1[4] = pEVar4;
      puVar1[5] = uVar5;
      puVar1 = puVar1 + 4;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = pDVar9;
  return (pointer)((long)pDVar9 + lVar12);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}